

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utilities.cpp
# Opt level: O0

void __thiscall ThreadedImageSaver::ThreadedImageSaver(ThreadedImageSaver *this)

{
  uint uVar1;
  vector<std::thread,_std::allocator<std::thread>_> *in_RDI;
  size_t i;
  vector<std::thread,_std::allocator<std::thread>_> *__args_1;
  condition_variable *this_00;
  ulong local_10;
  
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)0x133ba8);
  __args_1 = in_RDI + 1;
  std::
  vector<std::pair<Image,_std::filesystem::__cxx11::path>,_std::allocator<std::pair<Image,_std::filesystem::__cxx11::path>_>_>
  ::vector((vector<std::pair<Image,_std::filesystem::__cxx11::path>,_std::allocator<std::pair<Image,_std::filesystem::__cxx11::path>_>_>
            *)0x133bbb);
  this_00 = (condition_variable *)(in_RDI + 2);
  std::condition_variable::condition_variable(this_00);
  std::mutex::mutex((mutex *)0x133bdc);
  *(undefined1 *)
   &in_RDI[5].super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = 0;
  local_10 = 0;
  while( true ) {
    uVar1 = std::thread::hardware_concurrency();
    if (uVar1 <= local_10) break;
    std::vector<std::thread,std::allocator<std::thread>>::
    emplace_back<void(ThreadedImageSaver::*)(),ThreadedImageSaver*>
              (in_RDI,(type *)this_00,(ThreadedImageSaver **)__args_1);
    local_10 = local_10 + 1;
  }
  return;
}

Assistant:

ThreadedImageSaver::ThreadedImageSaver() {
	for (size_t i = 0; i < std::thread::hardware_concurrency(); i++) {
		threads.emplace_back(&ThreadedImageSaver::runThread, this);
	}
}